

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

VkFragmentShadingRateCombinerOpKHR
Diligent::ShadingRateCombinerToVkFragmentShadingRateCombinerOp(SHADING_RATE_COMBINER Combiner)

{
  VkFragmentShadingRateCombinerOpKHR VVar1;
  string msg;
  string local_30;
  
  if ((byte)(Combiner ^ Combiner - SHADING_RATE_COMBINER_PASSTHROUGH) <=
      (byte)(Combiner - SHADING_RATE_COMBINER_PASSTHROUGH)) {
    FormatString<char[40]>(&local_30,(char (*) [40])"Only single combiner should be provided");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"ShadingRateCombinerToVkFragmentShadingRateCombinerOp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x786);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  switch(Combiner) {
  case SHADING_RATE_COMBINER_PASSTHROUGH:
    VVar1 = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_KEEP_KHR;
    break;
  case SHADING_RATE_COMBINER_OVERRIDE:
    VVar1 = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_REPLACE_KHR;
    break;
  case SHADING_RATE_COMBINER_MIN:
    VVar1 = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_MIN_KHR;
    break;
  case SHADING_RATE_COMBINER_MAX:
    VVar1 = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_MAX_KHR;
    break;
  default:
    if ((Combiner == SHADING_RATE_COMBINER_SUM) || (Combiner == SHADING_RATE_COMBINER_LAST)) {
      return VK_FRAGMENT_SHADING_RATE_COMBINER_OP_MUL_KHR;
    }
  case SHADING_RATE_COMBINER_OVERRIDE|SHADING_RATE_COMBINER_PASSTHROUGH:
  case SHADING_RATE_COMBINER_MIN|SHADING_RATE_COMBINER_PASSTHROUGH:
  case SHADING_RATE_COMBINER_MIN|SHADING_RATE_COMBINER_OVERRIDE:
  case SHADING_RATE_COMBINER_MIN|SHADING_RATE_COMBINER_OVERRIDE|SHADING_RATE_COMBINER_PASSTHROUGH:
    FormatString<char[33]>(&local_30,(char (*) [33])"Unexpected shading rate combiner");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"ShadingRateCombinerToVkFragmentShadingRateCombinerOp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x792);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    VVar1 = VK_FRAGMENT_SHADING_RATE_COMBINER_OP_MAX_ENUM_KHR;
  }
  return VVar1;
}

Assistant:

VkFragmentShadingRateCombinerOpKHR ShadingRateCombinerToVkFragmentShadingRateCombinerOp(SHADING_RATE_COMBINER Combiner)
{
    static_assert(SHADING_RATE_COMBINER_LAST == (1u << 5), "Please update the switch below to handle the new shading rate combiner");
    VERIFY(IsPowerOfTwo(Uint32{Combiner}), "Only single combiner should be provided");
    switch (Combiner)
    {
        // clang-format off
        case SHADING_RATE_COMBINER_PASSTHROUGH: return VK_FRAGMENT_SHADING_RATE_COMBINER_OP_KEEP_KHR;
        case SHADING_RATE_COMBINER_OVERRIDE:    return VK_FRAGMENT_SHADING_RATE_COMBINER_OP_REPLACE_KHR;
        case SHADING_RATE_COMBINER_MIN:         return VK_FRAGMENT_SHADING_RATE_COMBINER_OP_MIN_KHR;
        case SHADING_RATE_COMBINER_MAX:         return VK_FRAGMENT_SHADING_RATE_COMBINER_OP_MAX_KHR;
        case SHADING_RATE_COMBINER_SUM:
        case SHADING_RATE_COMBINER_MUL:         return VK_FRAGMENT_SHADING_RATE_COMBINER_OP_MUL_KHR;
        // clang-format on
        default:
            UNEXPECTED("Unexpected shading rate combiner");
            return VK_FRAGMENT_SHADING_RATE_COMBINER_OP_MAX_ENUM_KHR;
    }
}